

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qguiapplication.cpp
# Opt level: O2

QPlatformDropQtResponse
QGuiApplicationPrivate::processDrop
          (QWindow *w,QMimeData *dropData,QPoint *p,DropActions supportedActions,
          MouseButtons buttons,KeyboardModifiers modifiers)

{
  double dVar1;
  DropAction acceptedAction;
  long in_FS_OFFSET;
  QPointF local_98;
  undefined1 *local_88;
  undefined8 uStack_80;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined1 *local_68;
  undefined8 uStack_60;
  undefined1 *local_58;
  QMimeData *pQStack_50;
  QPlatformDropQtResponse local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  mouse_buttons = buttons;
  modifier_buttons = modifiers;
  QWeakPointer<QObject>::assign<QObject>(&currentDragWindow.wp,(QObject *)0x0);
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  uStack_80 = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = 0xffffffff;
  uStack_74 = 0xffffffff;
  uStack_70 = 0xffffffff;
  uStack_6c = 0xffffffff;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  uStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_50 = (QMimeData *)&DAT_aaaaaaaaaaaaaaaa;
  dVar1 = (double)(*p).yp.m_i;
  local_98.yp._0_4_ = SUB84(dVar1,0);
  local_98.xp = (double)(*p).xp.m_i;
  local_98.yp._4_4_ = (int)((ulong)dVar1 >> 0x20);
  QDropEvent::QDropEvent
            ((QDropEvent *)&local_88,&local_98,supportedActions,dropData,buttons,modifiers,Drop);
  QCoreApplication::sendEvent((QObject *)w,(QEvent *)&local_88);
  acceptedAction = (uint)uStack_80._4_1_;
  if (uStack_80._4_1_ != false) {
    acceptedAction = uStack_60._4_4_;
  }
  local_40 = (QPlatformDropQtResponse)&DAT_aaaaaaaaaaaaaaaa;
  QPlatformDropQtResponse::QPlatformDropQtResponse(&local_40,uStack_80._4_1_,acceptedAction);
  QDropEvent::~QDropEvent((QDropEvent *)&local_88);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return local_40;
  }
  __stack_chk_fail();
}

Assistant:

QPlatformDropQtResponse QGuiApplicationPrivate::processDrop(QWindow *w, const QMimeData *dropData,
                                                            const QPoint &p, Qt::DropActions supportedActions,
                                                            Qt::MouseButtons buttons, Qt::KeyboardModifiers modifiers)
{
    updateMouseAndModifierButtonState(buttons, modifiers);

    currentDragWindow = nullptr;

    QDropEvent de(p, supportedActions, dropData, buttons, modifiers);
    QGuiApplication::sendEvent(w, &de);

    Qt::DropAction acceptedAction = de.isAccepted() ? de.dropAction() : Qt::IgnoreAction;
    QPlatformDropQtResponse response(de.isAccepted(),acceptedAction);
    return response;
}